

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

mbedtls_cipher_info_t *
mbedtls_cipher_info_from_values
          (mbedtls_cipher_id_t cipher_id,int key_bitlen,mbedtls_cipher_mode_t mode)

{
  mbedtls_cipher_info_t *pmVar1;
  mbedtls_cipher_info_t **ppmVar2;
  
  pmVar1 = &aes_128_ecb_info;
  ppmVar2 = &mbedtls_cipher_definitions[1].info;
  while (((pmVar1->base->cipher != cipher_id || (pmVar1->key_bitlen != key_bitlen)) ||
         (pmVar1->mode != mode))) {
    pmVar1 = *ppmVar2;
    ppmVar2 = ppmVar2 + 2;
    if (pmVar1 == (mbedtls_cipher_info_t *)0x0) {
      return (mbedtls_cipher_info_t *)0x0;
    }
  }
  return pmVar1;
}

Assistant:

const mbedtls_cipher_info_t *mbedtls_cipher_info_from_values( const mbedtls_cipher_id_t cipher_id,
                                              int key_bitlen,
                                              const mbedtls_cipher_mode_t mode )
{
    const mbedtls_cipher_definition_t *def;

    for( def = mbedtls_cipher_definitions; def->info != NULL; def++ )
        if( def->info->base->cipher == cipher_id &&
            def->info->key_bitlen == (unsigned) key_bitlen &&
            def->info->mode == mode )
            return( def->info );

    return( NULL );
}